

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLargeDataWindowOffsets.cpp
# Opt level: O2

ChannelList *
anon_unknown.dwarf_173e3c::setupBuffer
          (ChannelList *__return_storage_ptr__,Header *hdr,char **channels,PixelType *pt,
          FrameBuffer *buf,bool writing)

{
  _Rb_tree_header *p_Var1;
  Channel *pCVar2;
  Slice *pSVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  undefined8 *puVar8;
  long lVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  Vec2 *pVVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  void *pvVar17;
  size_t i;
  vector<char,_std::allocator<char>_> *this;
  pointer pcVar18;
  long lVar19;
  undefined1 auVar20 [16];
  int local_a8;
  int iStack_a0;
  undefined8 local_78;
  undefined8 uStack_70;
  Channel local_68 [56];
  
  puVar8 = (undefined8 *)Imf_3_2::Header::dataWindow();
  uVar4 = *puVar8;
  uVar5 = puVar8[1];
  lVar12 = -1;
  lVar19 = 4;
  do {
    lVar19 = lVar19 + -4;
    lVar9 = lVar12 + 1;
    lVar12 = lVar12 + 1;
  } while (channels[lVar9] != (char *)0x0);
  local_78 = uVar4;
  uStack_70 = uVar5;
  lVar9 = Imf_3_2::Header::dataWindow();
  iVar7 = *(int *)(lVar9 + 8);
  piVar10 = (int *)Imf_3_2::Header::dataWindow();
  lVar15 = (long)((iVar7 - *piVar10) + 1);
  lVar9 = Imf_3_2::Header::dataWindow();
  iVar7 = *(int *)(lVar9 + 0xc);
  lVar9 = Imf_3_2::Header::dataWindow();
  lVar9 = (long)((iVar7 - *(int *)(lVar9 + 4)) + 1);
  this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::readingBuffer;
  if (writing) {
    this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::writingBuffer;
  }
  std::vector<char,_std::allocator<char>_>::resize(this,lVar12 * lVar15 * lVar9 * 4);
  pcVar18 = (this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  lVar14 = 0;
  lVar16 = 0;
  do {
    if (lVar14 == lVar15 * lVar9 * lVar12) {
      (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      p_Var1 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_a8 = (int)uVar4;
      iStack_a0 = (int)uVar5;
      iVar7 = (iStack_a0 - local_a8) + 1;
      puVar8 = &(anonymous_namespace)::readingBuffer;
      if (writing) {
        puVar8 = &(anonymous_namespace)::writingBuffer;
      }
      pVVar13 = (Vec2 *)*puVar8;
      for (lVar9 = 0; lVar12 != lVar9; lVar9 = lVar9 + 1) {
        pvVar17 = (void *)0x1;
        if (pt != (PixelType *)0x0) {
          pvVar17 = (void *)(ulong)pt[lVar9];
        }
        pCVar2 = (Channel *)channels[lVar9];
        Imf_3_2::Channel::Channel(local_68,(PixelType)pvVar17,1,1,false);
        Imf_3_2::ChannelList::insert((char *)__return_storage_ptr__,pCVar2);
        pSVar3 = (Slice *)channels[lVar9];
        auVar20._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar20._0_8_ = lVar9;
        auVar20._12_4_ = 0x45300000;
        Imf_3_2::Slice::Make
                  ((PixelType)local_68,pvVar17,pVVar13,(long)&local_78,(long)iVar7,1,-lVar19,
                   (int)-lVar19 * iVar7,1,
                   (auVar20._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0) + 100.0,true,false
                  );
        Imf_3_2::FrameBuffer::insert((char *)buf,pSVar3);
        pVVar13 = pVVar13 + 4;
      }
      return __return_storage_ptr__;
    }
    do {
      uVar6 = random_int(0xffff);
      if ((~uVar6 & 0x7c00) != 0) break;
    } while ((uVar6 & 0x3ff) != 0);
    if ((pt == (PixelType *)0x0) || (pt[lVar16] == HALF)) {
      *(short *)pcVar18 = (short)uVar6;
    }
    else {
      *(undefined4 *)pcVar18 =
           *(undefined4 *)(_imath_half_to_float_table + (ulong)(uVar6 & 0xffff) * 4);
    }
    lVar11 = lVar12 - lVar16;
    lVar16 = lVar16 + 1;
    pcVar18 = pcVar18 + 4;
    if (lVar11 == 1) {
      lVar16 = 0;
    }
    lVar14 = lVar14 + 1;
  } while( true );
}

Assistant:

ChannelList
setupBuffer (
    const Header&      hdr,      // header to grab datawindow from
    const char* const* channels, // NULL terminated list of channels to write
    const PixelType*   pt,
    FrameBuffer&       buf,    // buffer to fill with pointers to channel
    bool               writing // true if should allocate
)
{
    Box2i dw = hdr.dataWindow ();

    //
    // how many channels in total
    //
    size_t activechans = 0;

    while (channels[activechans] != NULL)
    {
        activechans++;
    }

    size_t samples =
        size_t (hdr.dataWindow ().max.x + 1 - hdr.dataWindow ().min.x) *
        size_t (hdr.dataWindow ().max.y + 1 - hdr.dataWindow ().min.y) *
        activechans;

    // always allocate four bytes for each sample, even half types. to keep floats word-aligned
    size_t size = samples * 4;

    if (writing) { writingBuffer.resize (size); }
    else
    {
        readingBuffer.resize (size);
    }

    const char* write_ptr = writing ? &writingBuffer[0] : &readingBuffer[0];
    // fill with random halfs, casting to floats for float channels - don't write NaN values
    size_t chan = 0;
    for (size_t i = 0; i < samples; i++)
    {

        half v;
        do
        {
            unsigned short int values =
                random_int (std::numeric_limits<unsigned short>::max ());
            v.setBits (values);
        } while (v.isNan ());

        if (pt == NULL || pt[chan] == IMF::HALF)
        {
            *(half*) write_ptr = half (v);
        }
        else
        {
            *(float*) write_ptr = float (v);
        }
        chan++;
        write_ptr += 4;
        if (chan == activechans) { chan = 0; }
    }

    ChannelList chanlist;

    int64_t width         = (dw.max.x + 1 - dw.min.x);
    int64_t bytes_per_row = activechans * 4 * width;

    const char* offset =
        (writing ? writingBuffer.data () : readingBuffer.data ());
    for (size_t i = 0; i < activechans; i++)
    {
        PixelType type = pt == NULL ? IMF::HALF : pt[i];

        chanlist.insert (channels[i], type);
        buf.insert (
            channels[i],
            Slice::Make (
                type,
                offset,
                dw.min,
                width,
                1,
                activechans * 4,
                bytes_per_row,
                1,
                1,
                100. + i,
                false,
                false));
        offset += 4;
    }

    return chanlist;
}